

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O0

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          uint batchSize,InnerRegisterSupplier *registerSupplier)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  const_reference pvVar5;
  undefined4 extraout_var;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
  *pCVar6;
  size_type sVar7;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
  *in_RCX;
  path *in_RDX;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
  *in_RSI;
  OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void> *in_RDI;
  uint in_R8D;
  KeyValue<supermap::Key<2UL>,_unsigned_int> minItem;
  int32_t i_1;
  bool hasMin;
  size_t min;
  anon_class_24_3_5b0b3c05 dropWriteBuffer;
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
  writeBuffer;
  anon_class_24_3_7a9e0d2b updateOnce;
  size_t i;
  uint64_t totalSize;
  vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
  frontLine;
  vector<unsigned_int,_std::allocator<unsigned_int>_> currentFrontPointers;
  size_t storagesCount;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>_>_>_()>
  *in_stack_fffffffffffffde8;
  path *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  anon_class_24_3_5b0b3c05 *in_stack_fffffffffffffe00;
  KeyValue<supermap::Key<2UL>,_unsigned_int> *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  format in_stack_fffffffffffffe17;
  string_type *in_stack_fffffffffffffe18;
  path *in_stack_fffffffffffffe20;
  InnerRegisterSupplier *in_stack_fffffffffffffe58;
  shared_ptr<supermap::io::FileManager> *in_stack_fffffffffffffe60;
  int local_158;
  size_type local_150;
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
  local_130;
  undefined1 *local_118;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
  *local_110;
  vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
  *local_108;
  undefined8 local_100;
  ulong local_f8;
  long local_f0;
  vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
  local_d8;
  undefined1 local_b8 [24];
  size_type local_a0;
  uint local_24;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
  *local_10;
  
  local_24 = in_R8D;
  local_10 = in_RSI;
  std::filesystem::__cxx11::path::path
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe17);
  std::shared_ptr<supermap::io::FileManager>::shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffdf0,
             (shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffde8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>_>_>_()>
              *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
  ::SingleFileIndexedStorage(in_RCX,in_RDX,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>_>_>_()>
               *)0x163312);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x16331f);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffdf0);
  Findable<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_supermap::Key<2UL>_>::Findable
            ((Findable<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_supermap::Key<2UL>_> *)
             &in_RDI[1].register_.count_);
  in_RDI->_vptr_OrderedStorage = (_func_int **)&PTR_append_0038a510;
  *(undefined **)&in_RDI[1].register_.count_ = &DAT_0038a558;
  local_a0 = std::
             vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
             ::size(local_10);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x16338e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             (size_type)in_stack_fffffffffffffe08,(allocator_type *)in_stack_fffffffffffffe00);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1633b4);
  std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>::optional();
  std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>::allocator
            ((allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_> *)
             0x1633e5);
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
  ::vector((vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
           (size_type)in_stack_fffffffffffffe08,(value_type *)in_stack_fffffffffffffe00,
           (allocator_type *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
  std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>::~allocator
            ((allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_> *)
             0x163410);
  local_f0 = 0;
  for (local_f8 = 0; local_f8 < local_a0; local_f8 = local_f8 + 1) {
    pvVar5 = std::
             vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
             ::operator[](local_10,local_f8);
    iVar3 = (*(pvVar5->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
              ._vptr_OrderedStorage[1])();
    if (iVar3 != 0) {
      std::
      vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
      ::operator[](&local_d8,local_f8);
      pvVar5 = std::
               vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
               ::operator[](local_10,local_f8);
      iVar3 = (*(pvVar5->
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                ).
                super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                .
                super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                ._vptr_OrderedStorage[4])(pvVar5,0);
      local_100 = CONCAT44(extraout_var,iVar3);
      std::optional<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>::
      emplace<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>
                ((optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_> *)
                 in_stack_fffffffffffffdf0,
                 (KeyValue<supermap::Key<2UL>,_unsigned_int> *)in_stack_fffffffffffffde8);
      pvVar5 = std::
               vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
               ::operator[](local_10,local_f8);
      uVar4 = (*(pvVar5->
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                ).
                super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                .
                super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                ._vptr_OrderedStorage[1])();
      local_f0 = (ulong)uVar4 + local_f0;
    }
  }
  pCVar6 = OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
           ::getRegister(in_RDI);
  (*(pCVar6->
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>
    ).
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>_>
    ._vptr_Cloneable[5])(pCVar6,local_f0);
  local_118 = local_b8;
  local_110 = local_10;
  local_108 = &local_d8;
  std::
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
  ::vector((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
            *)0x163622);
  std::
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
             *)in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  while( true ) {
    local_150 = 0;
    bVar1 = false;
    local_158 = (int)local_a0;
    while (local_158 = local_158 + -1, -1 < local_158) {
      std::
      vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
      ::operator[](&local_d8,(long)local_158);
      bVar2 = std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>::has_value
                        ((optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_> *)0x1636bb
                        );
      if (bVar2) {
        if (bVar1) {
          std::
          vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
          ::operator[](&local_d8,(long)local_158);
          std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>::value
                    ((optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_> *)
                     in_stack_fffffffffffffdf0);
          std::
          vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
          ::operator[](&local_d8,local_150);
          std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>::value
                    ((optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_> *)
                     in_stack_fffffffffffffdf0);
          in_stack_fffffffffffffe17 =
               KeyValue<supermap::Key<2UL>,_unsigned_int>::operator<
                         ((KeyValue<supermap::Key<2UL>,_unsigned_int> *)in_stack_fffffffffffffdf0,
                          (KeyValue<supermap::Key<2UL>,_unsigned_int> *)in_stack_fffffffffffffde8);
          if ((bool)in_stack_fffffffffffffe17) {
            local_150 = (size_type)local_158;
          }
          else {
            std::
            vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
            ::operator[](&local_d8,(long)local_158);
            in_stack_fffffffffffffe08 =
                 std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>::value
                           ((optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_> *)
                            in_stack_fffffffffffffdf0);
            std::
            vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
            ::operator[](&local_d8,local_150);
            in_stack_fffffffffffffe00 =
                 (anon_class_24_3_5b0b3c05 *)
                 std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>::value
                           ((optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_> *)
                            in_stack_fffffffffffffdf0);
            bVar2 = KeyValue<supermap::Key<2UL>,_unsigned_int>::operator==
                              ((KeyValue<supermap::Key<2UL>,_unsigned_int> *)
                               in_stack_fffffffffffffdf0,
                               (KeyValue<supermap::Key<2UL>,_unsigned_int> *)
                               in_stack_fffffffffffffde8);
            if (bVar2) {
              SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()
                        ((anon_class_24_3_7a9e0d2b *)
                         CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                         (int32_t)((ulong)in_stack_fffffffffffffe08 >> 0x20));
            }
          }
        }
        else {
          bVar1 = true;
          local_150 = (size_type)local_158;
        }
      }
    }
    if (!bVar1) break;
    std::
    vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
    ::operator[](&local_d8,local_150);
    in_stack_fffffffffffffdf0 =
         (path *)std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>::value
                           ((optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_> *)
                            in_stack_fffffffffffffdf0);
    SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()
              ((anon_class_24_3_7a9e0d2b *)
               CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               (int32_t)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    std::
    vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
    ::push_back((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
                 *)in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
    sVar7 = std::
            vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
            ::size(&local_130);
    if (local_24 <= (uint)sVar7) {
      SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()
                (in_stack_fffffffffffffe00);
    }
  }
  SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(in_stack_fffffffffffffe00);
  std::
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
  ::~vector((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
             *)in_stack_fffffffffffffe00);
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
  ::~vector((vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
             *)in_stack_fffffffffffffe00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe00);
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }